

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsf_Emu.cpp
# Opt level: O0

void __thiscall Nsf_Emu::unload(Nsf_Emu *this)

{
  long in_RDI;
  Music_Emu *this_00;
  
  if (*(long *)(in_RDI + 0xb60) != 0) {
    Nes_Vrc6_Apu::operator_delete((void *)0x95e75f);
  }
  *(undefined8 *)(in_RDI + 0xb60) = 0;
  this_00 = *(Music_Emu **)(in_RDI + 0xb58);
  if (this_00 != (Music_Emu *)0x0) {
    Nes_Namco_Apu::operator_delete((void *)0x95e78b);
  }
  *(undefined8 *)(in_RDI + 0xb58) = 0;
  if (*(long *)(in_RDI + 0xb68) != 0) {
    Nes_Fme7_Apu::operator_delete((void *)0x95e7b5);
  }
  *(undefined8 *)(in_RDI + 0xb68) = 0;
  Rom_Data<4096>::clear((Rom_Data<4096> *)0x95e7d1);
  Music_Emu::unload(this_00);
  return;
}

Assistant:

void Nsf_Emu::unload()
{
	#if !NSF_EMU_APU_ONLY
	{
		delete vrc6;
		vrc6  = 0;
		
		delete namco;
		namco = 0;
		
		delete fme7;
		fme7  = 0;
	}
	#endif
	
	rom.clear();
	Music_Emu::unload();
}